

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QDateTimeParser::SectionNode,QDateTimeParser::SectionNode>
                    (QList<QDateTimeParser::SectionNode> *vector,SectionNode *u,qsizetype from)

{
  undefined4 uVar1;
  ulong uVar2;
  SectionNode *pSVar3;
  undefined4 uVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  long lVar8;
  int *piVar9;
  qsizetype qVar10;
  SectionNode SVar11;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar2 = (vector->d).size;
  if ((ulong)from < uVar2) {
    pSVar3 = (vector->d).ptr;
    piVar9 = &pSVar3[from].count;
    lVar5 = uVar2 * 0x10 + from * -0x10;
    lVar6 = 0x10 - (long)(pSVar3 + from);
    do {
      qVar10 = lVar6;
      lVar8 = lVar5;
      if (lVar8 == 0) goto LAB_003f3924;
      uVar1 = ((SectionNode *)(piVar9 + -2))->type;
      uVar4 = ((SectionNode *)(piVar9 + -2))->pos;
      SVar11.pos = uVar4;
      SVar11.type = uVar1;
      SVar11._8_8_ = *(undefined8 *)piVar9;
      cVar7 = ::operator==(SVar11,*u);
      piVar9 = piVar9 + 4;
      lVar5 = lVar8 + -0x10;
      lVar6 = qVar10 + -0x10;
    } while (cVar7 == '\0');
    qVar10 = -((long)&(vector->d).ptr[-1].type + qVar10) >> 4;
LAB_003f3924:
    if (lVar8 != 0) {
      return qVar10;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}